

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

void __thiscall Omega_h::CmdLine::add_arg<int>(CmdLine *this,string *name,int *defval)

{
  CmdLineArg<int> *this_00;
  unique_ptr<Omega_h::CmdLineArg<int>,_std::default_delete<Omega_h::CmdLineArg<int>_>_> local_30;
  unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> local_28;
  int *local_20;
  int *defval_local;
  string *name_local;
  CmdLine *this_local;
  
  local_20 = defval;
  defval_local = (int *)name;
  name_local = (string *)this;
  this_00 = (CmdLineArg<int> *)operator_new(0x30);
  CmdLineArg<int>::CmdLineArg(this_00,(string *)defval_local,local_20);
  std::unique_ptr<Omega_h::CmdLineArg<int>,std::default_delete<Omega_h::CmdLineArg<int>>>::
  unique_ptr<std::default_delete<Omega_h::CmdLineArg<int>>,void>
            ((unique_ptr<Omega_h::CmdLineArg<int>,std::default_delete<Omega_h::CmdLineArg<int>>> *)
             &local_30,this_00);
  std::unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>>::
  unique_ptr<Omega_h::CmdLineArg<int>,std::default_delete<Omega_h::CmdLineArg<int>>,void>
            ((unique_ptr<Omega_h::CmdLineItem,std::default_delete<Omega_h::CmdLineItem>> *)&local_28
             ,&local_30);
  std::
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  ::push_back(&this->args_,(value_type *)&local_28);
  std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>::~unique_ptr
            (&local_28);
  std::unique_ptr<Omega_h::CmdLineArg<int>,_std::default_delete<Omega_h::CmdLineArg<int>_>_>::
  ~unique_ptr(&local_30);
  return;
}

Assistant:

void CmdLine::add_arg(std::string const& name, T const& defval) {
  args_.push_back(
      std::unique_ptr<CmdLineArg<T>>(new CmdLineArg<T>(name, defval)));
}